

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void band_nz_1d(float32 *v,uint32 d1,float32 band)

{
  uint local_1c;
  uint32 i;
  float32 band_local;
  uint32 d1_local;
  float32 *v_local;
  
  for (local_1c = 0; local_1c < d1; local_1c = local_1c + 1) {
    if (((float)v[local_1c] != 0.0) || (NAN((float)v[local_1c]))) {
      if (((float)v[local_1c] <= 0.0) || ((float)band <= (float)v[local_1c])) {
        if (((float)v[local_1c] <= 0.0 && (float)v[local_1c] != 0.0) &&
           (-(float)band < (float)v[local_1c])) {
          v[local_1c] = (float32)-(float)band;
        }
      }
      else {
        v[local_1c] = band;
      }
    }
  }
  return;
}

Assistant:

void
band_nz_1d(float32 *v,
	   uint32 d1,
	   float32 band)
{
    uint32 i;

    for (i = 0; i < d1; i++) {
	if (v[i] != 0) {
	    if ((v[i] > 0) && (v[i] < band)) {
		v[i] = band;
	    }
	    else if ((v[i] < 0) && (v[i] > -band)) {
		v[i] = -band;
	    }
	}
    }
}